

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O3

DynamicStaleResourceWrapper __thiscall
Diligent::DynamicStaleResourceWrapper::
Create<std::unique_ptr<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,std::default_delete<VulkanUtilities::VulkanCommandBufferPool>>[],std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,std::default_delete<VulkanUtilities::VulkanCommandBufferPool>>[]>>,void>
          (DynamicStaleResourceWrapper *this,
          unique_ptr<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[],_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
          *Resource,RefCounterType NumReferences)

{
  StaleResourceBase *pSVar1;
  char (*in_RCX) [19];
  string msg;
  string local_40;
  
  if (NumReferences < 1) {
    FormatString<char[26],char[19]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"NumReferences >= 1",in_RCX);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/ResourceReleaseQueue.hpp"
               ,0x48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else if (NumReferences == 1) {
    pSVar1 = (StaleResourceBase *)operator_new(0x10);
    pSVar1->_vptr_StaleResourceBase = (_func_int **)&PTR__SpecificStaleResource_0091cf28;
    pSVar1[1]._vptr_StaleResourceBase =
         (_func_int **)
         (Resource->_M_t).
         super___uniq_ptr_impl<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
         .
         super__Head_base<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_false>
         ._M_head_impl;
    (Resource->_M_t).
    super___uniq_ptr_impl<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
    .
    super__Head_base<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_false>
    ._M_head_impl =
         (unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
          *)0x0;
    goto LAB_001d9b29;
  }
  pSVar1 = (StaleResourceBase *)operator_new(0x18);
  pSVar1->_vptr_StaleResourceBase = (_func_int **)&PTR__SpecificSharedStaleResource_0091cf68;
  pSVar1[1]._vptr_StaleResourceBase =
       (_func_int **)
       (Resource->_M_t).
       super___uniq_ptr_impl<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
       .
       super__Head_base<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_false>
       ._M_head_impl;
  (Resource->_M_t).
  super___uniq_ptr_impl<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
  .
  super__Head_base<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
        *)0x0;
  pSVar1[2]._vptr_StaleResourceBase = (_func_int **)NumReferences;
LAB_001d9b29:
  this->m_pStaleResource = pSVar1;
  return (DynamicStaleResourceWrapper)(StaleResourceBase *)this;
}

Assistant:

static DynamicStaleResourceWrapper Create(ResourceType&& Resource, RefCounterType NumReferences)
    {
        VERIFY_EXPR(NumReferences >= 1);

        class SpecificStaleResource final : public StaleResourceBase
        {
        public:
            SpecificStaleResource(ResourceType&& SpecificResource) :
                m_SpecificResource(std::move(SpecificResource))
            {}

            // clang-format off
            SpecificStaleResource             (const SpecificStaleResource&) = delete;
            SpecificStaleResource             (SpecificStaleResource&&)      = delete;
            SpecificStaleResource& operator = (const SpecificStaleResource&) = delete;
            SpecificStaleResource& operator = (SpecificStaleResource&&)      = delete;
            // clang-format on

            virtual void Release() override final
            {
                delete this;
            }

        private:
            ResourceType m_SpecificResource;
        };

        class SpecificSharedStaleResource final : public StaleResourceBase
        {
        public:
            SpecificSharedStaleResource(ResourceType&& SpecificResource, RefCounterType NumReferences) :
                m_SpecificResource(std::move(SpecificResource)),
                m_RefCounter{NumReferences}
            {
            }

            // clang-format off
            SpecificSharedStaleResource             (const SpecificSharedStaleResource&) = delete;
            SpecificSharedStaleResource             (SpecificSharedStaleResource&&)      = delete;
            SpecificSharedStaleResource& operator = (const SpecificSharedStaleResource&) = delete;
            SpecificSharedStaleResource& operator = (SpecificSharedStaleResource&&)      = delete;
            // clang-format on

            virtual void Release() override final
            {
                if (m_RefCounter.fetch_add(-1) - 1 == 0)
                {
                    delete this;
                }
            }

        private:
            ResourceType                m_SpecificResource;
            std::atomic<RefCounterType> m_RefCounter;
        };

        return DynamicStaleResourceWrapper{
            NumReferences == 1 ?
                static_cast<StaleResourceBase*>(new SpecificStaleResource{std::move(Resource)}) :
                static_cast<StaleResourceBase*>(new SpecificSharedStaleResource{std::move(Resource), NumReferences})};
    }